

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outchars.c
# Opt level: O0

void free_displaychars(void)

{
  write_unisym_config();
  free_drawing_info(default_drawing);
  free_drawing_info(unicode_drawing);
  free_drawing_info(rogue_drawing);
  rogue_drawing = (curses_drawing_info *)0x0;
  default_drawing = (curses_drawing_info *)0x0;
  return;
}

Assistant:

void free_displaychars(void)
{
    write_unisym_config();
    
    free_drawing_info(default_drawing);
    free_drawing_info(unicode_drawing);
    free_drawing_info(rogue_drawing);
    
    default_drawing = rogue_drawing = NULL;
}